

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::BamHttp::Seek(BamHttp *this,int64_t *position,int origin)

{
  bool bVar1;
  int iVar2;
  string local_60;
  string local_40;
  
  iVar2 = (*(this->super_IBamIODevice)._vptr_IBamIODevice[10])();
  if ((char)iVar2 == '\0') {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BamHttp::Seek","");
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"cannot seek on unopen connection","");
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_60,&local_40);
LAB_00152c8e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_00152c9d;
  }
  else {
    DisconnectSocket(this);
    bVar1 = ConnectSocket(this);
    if (bVar1) {
      if (origin == 0) {
        this->m_filePosition = *position;
        return true;
      }
      if (origin == 1) {
        this->m_filePosition = this->m_filePosition + *position;
        return true;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BamHttp::Seek","");
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"unsupported seek origin","");
      IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_60,&local_40);
      goto LAB_00152c8e;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BamHttp::Seek","");
    TcpSocket::GetErrorString_abi_cxx11_(&local_40,this->m_socket);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_60,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_00152c9d;
  }
  operator_delete(local_40._M_dataplus._M_p);
LAB_00152c9d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool BamHttp::Seek(const int64_t& position, const int origin)
{

    // if HTTP device not in a valid state
    if (!IsOpen()) {
        SetErrorString("BamHttp::Seek", "cannot seek on unopen connection");
        return false;
    }

    // reset the connection
    DisconnectSocket();
    if (!ConnectSocket()) {
        SetErrorString("BamHttp::Seek", m_socket->GetErrorString());
        return false;
    }

    // udpate file position
    switch (origin) {
        case SEEK_CUR:
            m_filePosition += position;
            break;
        case SEEK_SET:
            m_filePosition = position;
            break;
        default:
            SetErrorString("BamHttp::Seek", "unsupported seek origin");
            return false;
    }

    // return success
    return true;
}